

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tattoo.c
# Opt level: O1

void do_brands(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  OBJ_DATA *pOVar2;
  OBJ_DATA *clone;
  char *txt;
  char arg1 [4608];
  char local_1228 [4616];
  
  if ((0x34 < ch->level) && (bVar1 = is_npc(ch), !bVar1)) {
    one_argument(argument,local_1228);
    if (local_1228[0] == '\0') {
      txt = "Syntax: tattoo <char>\n\r";
    }
    else {
      ch_00 = get_char_world(ch,local_1228);
      if (ch_00 == (CHAR_DATA *)0x0) {
        txt = "They aren\'t playing.\n\r";
      }
      else if (ch_00 == ch) {
        txt = "Trying to tattoo yourself?\n\r";
      }
      else {
        pOVar2 = get_eq_char(ch_00,0x13);
        if (pOVar2 == (OBJ_DATA *)0x0) {
          pOVar2 = get_eq_char(ch,0x13);
          if (pOVar2 != (OBJ_DATA *)0x0) {
            clone = create_object(pOVar2->pIndexData,0);
            clone_object(pOVar2,clone);
            obj_to_char(clone,ch_00);
            equip_char(ch_00,clone,0x13,true);
            act("You mark $N with $p!",ch,clone,ch_00,3);
            act("$n marks you with $p!",ch,clone,ch_00,2);
            act("$n marks $N with $p!",ch,clone,ch_00,1);
            return;
          }
          txt = "You don\'t have a brand yourself.\n\r";
        }
        else {
          txt = "That person already has a tattoo.\n\r";
        }
      }
    }
    send_to_char(txt,ch);
    return;
  }
  send_to_char("Huh?\n\r",ch);
  return;
}

Assistant:

void do_brands(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	OBJ_DATA *objj;

	if (ch->level < 53 || is_npc(ch))
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: tattoo <char>\n\r", ch);
		return;
	}

	if ((victim = get_char_world(ch, arg1)) == nullptr)
	{
		send_to_char("They aren't playing.\n\r", ch);
		return;
	}

	/*
	if (is_npc(victim))
	{
		send_to_char("Trying to tattoo a mob?\n\r", ch);
		return;
	}
	*/

	if (ch == victim)
	{
		send_to_char("Trying to tattoo yourself?\n\r", ch);
		return;
	}

	if ((obj = get_eq_char(victim, WEAR_BRAND)) != nullptr)
	{
		send_to_char("That person already has a tattoo.\n\r", ch);
		return;
	}

	if ((obj = get_eq_char(ch, WEAR_BRAND)) != nullptr)
	{
		objj = create_object(obj->pIndexData, 0);
		clone_object(obj, objj);
		obj_to_char(objj, victim);
		equip_char(victim, objj, WEAR_BRAND, true);

		act("You mark $N with $p!", ch, objj, victim, TO_CHAR);
		act("$n marks you with $p!", ch, objj, victim, TO_VICT);
		act("$n marks $N with $p!", ch, objj, victim, TO_NOTVICT);
		return;
	}

	send_to_char("You don't have a brand yourself.\n\r", ch);
}